

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Synth.cpp
# Opt level: O0

void __thiscall MT32Emu::Synth::setReportHandler2(Synth *this,ReportHandler2 *reportHandler2)

{
  ReportHandler2 *reportHandler2_local;
  Synth *this_local;
  
  if (reportHandler2 == (ReportHandler2 *)0x0) {
    this->reportHandler = &(this->extensions->defaultReportHandler).super_ReportHandler;
    this->extensions->reportHandler2 = &this->extensions->defaultReportHandler;
  }
  else {
    this->reportHandler = &reportHandler2->super_ReportHandler;
    this->extensions->reportHandler2 = reportHandler2;
  }
  return;
}

Assistant:

void Synth::setReportHandler2(ReportHandler2 *reportHandler2) {
	if (reportHandler2 != NULL) {
		reportHandler = reportHandler2;
		extensions.reportHandler2 = reportHandler2;
	} else {
		reportHandler = &extensions.defaultReportHandler;
		extensions.reportHandler2 = &extensions.defaultReportHandler;
	}
}